

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_distance.cpp
# Opt level: O2

size_type pstore::command_line::string_distance(string *from,string *to,size_type max_edit_distance)

{
  size_t n;
  ulong uVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  long lVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong n_00;
  ulong uVar8;
  initializer_list<unsigned_long> __l;
  unsigned_long local_270;
  long local_268;
  long local_260;
  small_vector<unsigned_long,_64UL> column;
  
  n = from->_M_string_length;
  uVar1 = to->_M_string_length;
  small_vector<unsigned_long,_64UL>::small_vector(&column,n + 1);
  uVar6 = 0;
  for (lVar5 = column.elements_ << 3; lVar5 != 0; lVar5 = lVar5 + -8) {
    column.buffer_[uVar6] = uVar6;
    uVar6 = uVar6 + 1;
  }
  uVar6 = max_edit_distance + 1;
  uVar8 = 1;
  do {
    if (uVar1 < uVar8) {
      puVar3 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&column,n);
      uVar6 = *puVar3;
      break;
    }
    puVar3 = small_vector<unsigned_long,64ul>::
             index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&column,0);
    *puVar3 = uVar8;
    uVar7 = uVar8;
    uVar4 = uVar8 - 1;
    for (n_00 = 1; n_00 <= n; n_00 = n_00 + 1) {
      puVar3 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&column,n_00);
      uVar2 = *puVar3;
      puVar3 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&column,n_00);
      local_270 = *puVar3 + 1;
      puVar3 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&column,n_00 - 1);
      local_268 = *puVar3 + 1;
      local_260 = uVar4 + ((from->_M_dataplus)._M_p[n_00 - 1] != (to->_M_dataplus)._M_p[uVar8 - 1]);
      __l._M_len = 3;
      __l._M_array = &local_270;
      uVar4 = std::min<unsigned_long>(__l);
      puVar3 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&column,n_00);
      *puVar3 = uVar4;
      puVar3 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&column,n_00);
      if (*puVar3 < uVar7) {
        uVar7 = *puVar3;
      }
      uVar4 = uVar2;
    }
    uVar8 = uVar8 + 1;
  } while ((max_edit_distance == 0) || (uVar7 <= max_edit_distance));
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&column.big_buffer_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return uVar6;
}

Assistant:

std::string::size_type string_distance (std::string const & from, std::string const & to,
                                                std::string::size_type const max_edit_distance) {
            using size_type = std::string::size_type;

            size_type const m = from.size ();
            size_type const n = to.size ();

            small_vector<size_type, 64> column (m + 1U);
            std::iota (std::begin (column), std::end (column), size_type{0});
            constexpr auto column_start = size_type{1};

            for (auto x = column_start; x <= n; x++) {
                column[0] = x;
                auto best_this_column = x;
                auto last_diagonal = x - column_start;
                for (auto y = column_start; y <= m; y++) {
                    auto const old_diagonal = column[y];
                    column[y] = std::min ({column[y] + 1U, column[y - 1U] + 1U,
                                           last_diagonal + (from[y - 1U] == to[x - 1U] ? 0U : 1U)});
                    last_diagonal = old_diagonal;
                    best_this_column = std::min (best_this_column, column[y]);
                }
                if (max_edit_distance != 0 && best_this_column > max_edit_distance) {
                    return max_edit_distance + 1U;
                }
            }
            return column[m];
        }